

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

FieldDescriptorProto *
google::protobuf::descriptor_unittest::AddExtension
          (FileDescriptorProto *file,string *extendee,string *name,int number,Label label,Type type)

{
  FieldDescriptorProto *this;
  uint32_t *puVar1;
  Arena *pAVar2;
  FieldDescriptorProto *result;
  Type type_local;
  Label label_local;
  int number_local;
  string *name_local;
  string *extendee_local;
  FileDescriptorProto *file_local;
  
  this = FileDescriptorProto::add_extension(file);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  pAVar2 = protobuf::MessageLite::GetArena((MessageLite *)this);
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,name,pAVar2);
  FieldDescriptorProto::set_number(this,number);
  FieldDescriptorProto::set_label(this,label);
  FieldDescriptorProto::set_type(this,type);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 2;
  pAVar2 = protobuf::MessageLite::GetArena((MessageLite *)this);
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.extendee_,extendee,pAVar2);
  return this;
}

Assistant:

FieldDescriptorProto* AddExtension(FileDescriptorProto* file,
                                   const std::string& extendee,
                                   const std::string& name, int number,
                                   FieldDescriptorProto::Label label,
                                   FieldDescriptorProto::Type type) {
  FieldDescriptorProto* result = file->add_extension();
  result->set_name(name);
  result->set_number(number);
  result->set_label(label);
  result->set_type(type);
  result->set_extendee(extendee);
  return result;
}